

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

void __thiscall
HighsHashTree<int,_HighsImplications::VarBound>::InnerLeaf<3>::move_backward
          (InnerLeaf<3> *this,int *first,int *last)

{
  difference_type __d;
  long lVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  iVar4 = *first;
  lVar1 = (long)iVar4;
  iVar2 = *last;
  if (iVar2 != iVar4) {
    lVar3 = iVar2 - lVar1;
    memmove((void *)((long)this + lVar3 * -0x18 + (long)iVar2 * 0x18 + 0x160),
            (this->entries)._M_elems + lVar1,lVar3 * 0x18);
    iVar4 = *first;
    iVar2 = *last;
    lVar1 = (long)iVar4;
  }
  memmove((this->hashes)._M_elems + (long)iVar4 + 1,(this->hashes)._M_elems + lVar1,
          (long)(iVar2 - iVar4) << 3);
  return;
}

Assistant:

void move_backward(const int& first, const int& last) {
      // move elements backwards
      std::move_backward(std::next(entries.begin(), first),
                         std::next(entries.begin(), last),
                         std::next(entries.begin(), last + 1));
      memmove(&hashes[first + 1], &hashes[first],
              sizeof(hashes[0]) * (last - first));
    }